

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  AssertionResult *this_00;
  AssertionResultData *pAVar1;
  OfType OVar2;
  long lVar3;
  pointer pMVar4;
  bool bVar5;
  XmlWriter *this_01;
  MessageInfo *msg;
  pointer pMVar6;
  ostream *os;
  long in_FS_OFFSET;
  ReusableStringStream rss;
  ScopedElement e;
  undefined1 local_a8 [48];
  string local_78;
  string elementName;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  OVar2 = (stats->assertionResult).m_resultData.resultType;
  if (((OVar2 & FailureBit) != Ok) &&
     (((stats->assertionResult).m_info.resultDisposition & SuppressFail) == 0)) {
    elementName._M_dataplus._M_p = (pointer)&elementName.field_2;
    elementName._M_string_length = 0;
    elementName.field_2._M_local_buf[0] = '\0';
    if ((((uint)(OVar2 + ~FailureBit) < 2) ||
        (((OVar2 == Unknown || (OVar2 == FailureBit)) || (OVar2 == Exception)))) ||
       (((OVar2 == FatalErrorCondition || (OVar2 == DidntThrowException)) ||
        (OVar2 == ThrewException)))) {
      std::__cxx11::string::assign((char *)&elementName);
    }
    this_01 = &this->xml;
    XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_01,(XmlFormatting)&elementName);
    std::__cxx11::string::string((string *)local_a8,"message",(allocator *)&rss);
    this_00 = &stats->assertionResult;
    AssertionResult::getExpression_abi_cxx11_(&local_78,this_00);
    XmlWriter::writeAttribute(this_01,(string *)local_a8,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::string((string *)local_a8,"type",(allocator *)&rss);
    local_78._M_dataplus._M_p = (stats->assertionResult).m_info.macroName.m_start;
    local_78._M_string_length = (stats->assertionResult).m_info.macroName.m_size;
    XmlWriter::writeAttribute<Catch::StringRef>(this_01,(string *)local_a8,(StringRef *)&local_78);
    std::__cxx11::string::~string((string *)local_a8);
    ReusableStringStream::ReusableStringStream(&rss);
    os = rss.m_oss;
    if ((stats->totals).assertions.failed + (stats->totals).assertions.passed +
        (stats->totals).assertions.failedButOk == 0) {
      std::operator<<(rss.m_oss,'\n');
    }
    else {
      std::operator<<(rss.m_oss,"FAILED");
      std::operator<<(os,":\n");
      if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
        std::operator<<(os,"  ");
        AssertionResult::getExpressionInMacro_abi_cxx11_((string *)local_a8,this_00);
        std::operator<<(os,(string *)local_a8);
        std::__cxx11::string::~string((string *)local_a8);
        std::operator<<(os,'\n');
      }
      bVar5 = AssertionResult::hasExpandedExpression(this_00);
      if (bVar5) {
        std::operator<<(os,"with expansion:\n");
        AssertionResult::getExpandedExpression_abi_cxx11_(&local_78,this_00);
        clara::TextFlow::Column::Column((Column *)local_a8,&local_78);
        local_a8._32_8_ = 2;
        clara::TextFlow::operator<<(os,(Column *)local_a8);
        std::operator<<(os,'\n');
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8);
        std::__cxx11::string::~string((string *)&local_78);
      }
    }
    pAVar1 = &(stats->assertionResult).m_resultData;
    std::__cxx11::string::string((string *)local_a8,(string *)pAVar1);
    std::__cxx11::string::~string((string *)local_a8);
    if ((pointer)local_a8._8_8_ != (pointer)0x0) {
      std::__cxx11::string::string((string *)local_a8,(string *)pAVar1);
      std::operator<<(os,(string *)local_a8);
      std::operator<<(os,'\n');
      std::__cxx11::string::~string((string *)local_a8);
    }
    pMVar4 = (stats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pMVar6 = (stats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar6 != pMVar4; pMVar6 = pMVar6 + 1) {
      if (pMVar6->type == Info) {
        std::operator<<(os,(string *)&pMVar6->message);
        os = rss.m_oss;
        std::operator<<(rss.m_oss,'\n');
      }
    }
    std::operator<<(os,"at ");
    local_a8._0_8_ = (stats->assertionResult).m_info.lineInfo.file;
    local_a8._8_8_ = (stats->assertionResult).m_info.lineInfo.line;
    Catch::operator<<(os,(SourceLineInfo *)local_a8);
    std::__cxx11::stringbuf::str();
    XmlWriter::writeText(this_01,(string *)local_a8,Newline);
    std::__cxx11::string::~string((string *)local_a8);
    ReusableStringStream::~ReusableStringStream(&rss);
    XmlWriter::ScopedElement::~ScopedElement(&e);
    std::__cxx11::string::~string((string *)&elementName);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void JunitReporter::writeAssertion( AssertionStats const& stats ) {
        AssertionResult const& result = stats.assertionResult;
        if( !result.isOk() ) {
            std::string elementName;
            switch( result.getResultType() ) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;

                // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
            }

            XmlWriter::ScopedElement e = xml.scopedElement( elementName );

            xml.writeAttribute( "message", result.getExpression() );
            xml.writeAttribute( "type", result.getTestMacroName() );

            ReusableStringStream rss;
            if (stats.totals.assertions.total() > 0) {
                rss << "FAILED" << ":\n";
                if (result.hasExpression()) {
                    rss << "  ";
                    rss << result.getExpressionInMacro();
                    rss << '\n';
                }
                if (result.hasExpandedExpression()) {
                    rss << "with expansion:\n";
                    rss << Column(result.getExpandedExpression()).indent(2) << '\n';
                }
            } else {
                rss << '\n';
            }

            if( !result.getMessage().empty() )
                rss << result.getMessage() << '\n';
            for( auto const& msg : stats.infoMessages )
                if( msg.type == ResultWas::Info )
                    rss << msg.message << '\n';

            rss << "at " << result.getSourceInfo();
            xml.writeText( rss.str(), XmlFormatting::Newline );
        }
    }